

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O0

int xclose(file_stream *strm)

{
  int iVar1;
  int *in_RDI;
  int ret;
  int local_c;
  
  local_c = 0;
  if ((*(byte *)(in_RDI + 4) & 1) == 0) {
    iVar1 = close(*in_RDI);
    if (iVar1 != 0) {
      msg_errno("Error closing %s",*(undefined8 *)(in_RDI + 2));
      local_c = -1;
    }
    free(*(void **)(in_RDI + 2));
  }
  if (*(long *)(in_RDI + 6) == 0) {
    free(*(void **)(in_RDI + 8));
  }
  else {
    munmap(*(void **)(in_RDI + 8),*(size_t *)(in_RDI + 10));
    in_RDI[6] = 0;
    in_RDI[7] = 0;
  }
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  *in_RDI = -1;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  return local_c;
}

Assistant:

int
xclose(struct file_stream *strm)
{
	int ret = 0;

	if (!strm->is_standard_stream) {
		if (close(strm->fd) != 0) {
			msg_errno("Error closing %"TS, strm->name);
			ret = -1;
		}
		free(strm->name);
	}

	if (strm->mmap_token != NULL) {
#ifdef _WIN32
		UnmapViewOfFile(strm->mmap_mem);
		CloseHandle((HANDLE)strm->mmap_token);
#else
		munmap(strm->mmap_mem, strm->mmap_size);
#endif
		strm->mmap_token = NULL;
	} else {
		free(strm->mmap_mem);
	}
	strm->mmap_mem = NULL;
	strm->fd = -1;
	strm->name = NULL;
	return ret;
}